

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::cmState(cmState *this)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_cmCacheManager_*,_false> _Var2;
  _Head_base<0UL,_cmCacheManager_*,_false> local_78 [9];
  
  p_Var1 = &(this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GlobalProperties).Map_._M_h._M_buckets =
       &(this->GlobalProperties).Map_._M_h._M_single_bucket;
  (this->GlobalProperties).Map_._M_h._M_bucket_count = 1;
  (this->GlobalProperties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GlobalProperties).Map_._M_h._M_element_count = 0;
  (this->GlobalProperties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->GlobalProperties).Map_._M_h._M_rehash_policy._M_next_resize,0,0x110);
  (this->SourceDirectory)._M_dataplus._M_p = (pointer)&(this->SourceDirectory).field_2;
  (this->SourceDirectory)._M_string_length = 0;
  (this->SourceDirectory).field_2._M_local_buf[0] = '\0';
  (this->BinaryDirectory)._M_dataplus._M_p = (pointer)&(this->BinaryDirectory).field_2;
  (this->BinaryDirectory)._M_string_length = 0;
  (this->BinaryDirectory).field_2._M_local_buf[0] = '\0';
  this->CurrentMode = Unknown;
  this->MSYSShell = false;
  this->IsInTryCompile = false;
  this->IsGeneratorMultiConfig = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->GhsMultiIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  std::make_unique<cmCacheManager>();
  _Var2._M_head_impl = local_78[0]._M_head_impl;
  local_78[0]._M_head_impl = (cmCacheManager *)0x0;
  std::__uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>::reset
            ((__uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_> *)
             &this->CacheManager,_Var2._M_head_impl);
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::~unique_ptr
            ((unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_> *)local_78);
  std::make_unique<cmGlobVerificationManager>();
  _Var2._M_head_impl = local_78[0]._M_head_impl;
  local_78[0]._M_head_impl = (cmCacheManager *)0x0;
  std::__uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  reset((__uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
         *)&this->GlobVerificationManager,(pointer)_Var2._M_head_impl);
  std::unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  ~unique_ptr((unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
               *)local_78);
  return;
}

Assistant:

cmState::cmState()
{
  this->CacheManager = cm::make_unique<cmCacheManager>();
  this->GlobVerificationManager = cm::make_unique<cmGlobVerificationManager>();
}